

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O2

int ecp_double_jac(mbedtls_ecp_group *grp,mbedtls_ecp_point *R,mbedtls_ecp_point *P)

{
  mbedtls_mpi *A;
  int iVar1;
  size_t count;
  size_t count_00;
  size_t count_01;
  size_t count_02;
  mbedtls_mpi S;
  mbedtls_mpi T;
  mbedtls_mpi U;
  mbedtls_mpi M;
  
  dbl_count = dbl_count + 1;
  mbedtls_mpi_init(&M);
  mbedtls_mpi_init(&S);
  mbedtls_mpi_init(&T);
  mbedtls_mpi_init(&U);
  if ((grp->A).p == (mbedtls_mpi_uint *)0x0) {
    iVar1 = mbedtls_mpi_mul_mod(grp,&S,&P->Z,&P->Z);
    if ((((iVar1 == 0) && (iVar1 = mbedtls_mpi_add_mod(grp,&T,&P->X,&S), iVar1 == 0)) &&
        (iVar1 = mbedtls_mpi_sub_mod(grp,&U,&P->X,&S), iVar1 == 0)) &&
       ((iVar1 = mbedtls_mpi_mul_mod(grp,&S,&T,&U), iVar1 == 0 &&
        (iVar1 = mbedtls_mpi_mul_int(&M,&S,3), iVar1 == 0)))) {
      do {
        iVar1 = mbedtls_mpi_cmp_mpi(&M,&grp->P);
        if (iVar1 < 0) goto LAB_0012681f;
        iVar1 = mbedtls_mpi_sub_abs(&M,&M,&grp->P);
      } while (iVar1 == 0);
    }
  }
  else {
    iVar1 = mbedtls_mpi_mul_mod(grp,&S,&P->X,&P->X);
    if ((iVar1 == 0) && (iVar1 = mbedtls_mpi_mul_int(&M,&S,3), iVar1 == 0)) {
      do {
        iVar1 = mbedtls_mpi_cmp_mpi(&M,&grp->P);
        if (iVar1 < 0) {
          iVar1 = mbedtls_mpi_cmp_int(&grp->A,0);
          if ((iVar1 == 0) ||
             ((((iVar1 = mbedtls_mpi_mul_mod(grp,&S,&P->Z,&P->Z), iVar1 == 0 &&
                (iVar1 = mbedtls_mpi_mul_mod(grp,&T,&S,&S), iVar1 == 0)) &&
               (iVar1 = mbedtls_mpi_mul_mod(grp,&S,&T,&grp->A), iVar1 == 0)) &&
              (iVar1 = mbedtls_mpi_add_mod(grp,&M,&M,&S), iVar1 == 0)))) {
LAB_0012681f:
            A = &P->Y;
            iVar1 = mbedtls_mpi_mul_mod(grp,&T,A,A);
            if ((((((iVar1 == 0) && (iVar1 = mbedtls_mpi_shift_l_mod(grp,&T,count), iVar1 == 0)) &&
                  ((iVar1 = mbedtls_mpi_mul_mod(grp,&S,&P->X,&T), iVar1 == 0 &&
                   ((iVar1 = mbedtls_mpi_shift_l_mod(grp,&S,count_00), iVar1 == 0 &&
                    (iVar1 = mbedtls_mpi_mul_mod(grp,&U,&T,&T), iVar1 == 0)))))) &&
                 (iVar1 = mbedtls_mpi_shift_l_mod(grp,&U,count_01), iVar1 == 0)) &&
                (((iVar1 = mbedtls_mpi_mul_mod(grp,&T,&M,&M), iVar1 == 0 &&
                  (iVar1 = mbedtls_mpi_sub_mod(grp,&T,&T,&S), iVar1 == 0)) &&
                 (iVar1 = mbedtls_mpi_sub_mod(grp,&T,&T,&S), iVar1 == 0)))) &&
               (((iVar1 = mbedtls_mpi_sub_mod(grp,&S,&S,&T), iVar1 == 0 &&
                 (iVar1 = mbedtls_mpi_mul_mod(grp,&S,&S,&M), iVar1 == 0)) &&
                ((((iVar1 = mbedtls_mpi_sub_mod(grp,&S,&S,&U), iVar1 == 0 &&
                   ((iVar1 = mbedtls_mpi_mul_mod(grp,&U,A,&P->Z), iVar1 == 0 &&
                    (iVar1 = mbedtls_mpi_shift_l_mod(grp,&U,count_02), iVar1 == 0)))) &&
                  (iVar1 = mbedtls_mpi_copy(&R->X,&T), iVar1 == 0)) &&
                 (iVar1 = mbedtls_mpi_copy(&R->Y,&S), iVar1 == 0)))))) {
              iVar1 = mbedtls_mpi_copy(&R->Z,&U);
            }
          }
          break;
        }
        iVar1 = mbedtls_mpi_sub_abs(&M,&M,&grp->P);
      } while (iVar1 == 0);
    }
  }
  mbedtls_mpi_free(&M);
  mbedtls_mpi_free(&S);
  mbedtls_mpi_free(&T);
  mbedtls_mpi_free(&U);
  return iVar1;
}

Assistant:

static int ecp_double_jac( const mbedtls_ecp_group *grp, mbedtls_ecp_point *R,
                           const mbedtls_ecp_point *P )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_mpi M, S, T, U;

#if defined(MBEDTLS_SELF_TEST)
    dbl_count++;
#endif

#if defined(MBEDTLS_ECP_DOUBLE_JAC_ALT)
    if( mbedtls_internal_ecp_grp_capable( grp ) )
        return( mbedtls_internal_ecp_double_jac( grp, R, P ) );
#endif /* MBEDTLS_ECP_DOUBLE_JAC_ALT */

    mbedtls_mpi_init( &M ); mbedtls_mpi_init( &S ); mbedtls_mpi_init( &T ); mbedtls_mpi_init( &U );

    /* Special case for A = -3 */
    if( grp->A.p == NULL )
    {
        /* M = 3(X + Z^2)(X - Z^2) */
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &S,  &P->Z,  &P->Z   ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_add_mod( grp, &T,  &P->X,  &S      ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mod( grp, &U,  &P->X,  &S      ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &S,  &T,     &U      ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_int( &M,  &S,     3       ) ); MOD_ADD( M );
    }
    else
    {
        /* M = 3.X^2 */
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &S,  &P->X,  &P->X   ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_int( &M,  &S,     3       ) ); MOD_ADD( M );

        /* Optimize away for "koblitz" curves with A = 0 */
        if( mbedtls_mpi_cmp_int( &grp->A, 0 ) != 0 )
        {
            /* M += A.Z^4 */
            MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &S,  &P->Z,  &P->Z   ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &T,  &S,     &S      ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &S,  &T,     &grp->A ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_add_mod( grp, &M,  &M,     &S      ) );
        }
    }

    /* S = 4.X.Y^2 */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &T,  &P->Y,  &P->Y   ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l_mod( grp, &T,  1               ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &S,  &P->X,  &T      ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l_mod( grp, &S,  1               ) );

    /* U = 8.Y^4 */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &U,  &T,     &T      ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l_mod( grp, &U,  1               ) );

    /* T = M^2 - 2.S */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &T,  &M,     &M      ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mod( grp, &T,  &T,     &S      ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mod( grp, &T,  &T,     &S      ) );

    /* S = M(S - T) - U */
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mod( grp, &S,  &S,     &T      ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &S,  &S,     &M      ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mod( grp, &S,  &S,     &U      ) );

    /* U = 2.Y.Z */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &U,  &P->Y,  &P->Z   ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l_mod( grp, &U,  1               ) );

    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &R->X, &T ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &R->Y, &S ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &R->Z, &U ) );

cleanup:
    mbedtls_mpi_free( &M ); mbedtls_mpi_free( &S ); mbedtls_mpi_free( &T ); mbedtls_mpi_free( &U );

    return( ret );
}